

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O0

void do_mark_delivered(quicly_local_cid_set_t *set,size_t idx)

{
  long in_RSI;
  long in_RDI;
  bool bVar1;
  quicly_local_cid_t *in_stack_00000018;
  quicly_local_cid_t *in_stack_00000020;
  undefined8 local_10;
  
  local_10 = in_RSI;
  if (*(int *)(in_RDI + 0x10 + in_RSI * 0x38) == 1) {
    while( true ) {
      bVar1 = false;
      if (local_10 + 1U < *(ulong *)(in_RDI + 0xf0)) {
        bVar1 = *(int *)(in_RDI + 0x10 + (local_10 + 1) * 0x38) == 1;
      }
      if (!bVar1) break;
      swap_cids(in_stack_00000020,in_stack_00000018);
      local_10 = local_10 + 1;
    }
  }
  *(undefined4 *)(in_RDI + 0x10 + local_10 * 0x38) = 3;
  return;
}

Assistant:

static void do_mark_delivered(quicly_local_cid_set_t *set, size_t idx)
{
    if (set->cids[idx].state == QUICLY_LOCAL_CID_STATE_PENDING) {
        /* if transitioning from PENDING, move it backward so the remaining PENDING CIDs come first */
        while (idx + 1 < set->_size && set->cids[idx + 1].state == QUICLY_LOCAL_CID_STATE_PENDING) {
            swap_cids(&set->cids[idx], &set->cids[idx + 1]);
            idx++;
        }
    }
    set->cids[idx].state = QUICLY_LOCAL_CID_STATE_DELIVERED;
}